

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void map_deinit_(map_base_t *m)

{
  map_node_t *pmVar1;
  uint uVar2;
  uint local_24;
  map_node_t *pmStack_20;
  int i;
  map_node_t *node;
  map_node_t *next;
  map_base_t *m_local;
  
  local_24 = m->nbuckets;
  while (uVar2 = local_24 - 1, local_24 != 0) {
    pmStack_20 = m->buckets[(int)uVar2];
    while (local_24 = uVar2, pmStack_20 != (map_node_t *)0x0) {
      pmVar1 = pmStack_20->next;
      golf_free_tracked(pmStack_20);
      pmStack_20 = pmVar1;
    }
  }
  golf_free_tracked(m->buckets);
  return;
}

Assistant:

void map_deinit_(map_base_t *m) {
  map_node_t *next, *node;
  int i;
  i = m->nbuckets;
  while (i--) {
    node = m->buckets[i];
    while (node) {
      next = node->next;
      golf_free(node);
      node = next;
    }
  }
  golf_free(m->buckets);
}